

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O3

error<idx2::err_code> idx2::WriteVolume(cstr FileName,volume *Vol,extent *Ext)

{
  u64 uVar1;
  u64 uVar2;
  FILE *__s;
  long lVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  byte *pbVar12;
  int iVar13;
  byte *pbVar14;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar15;
  undefined8 local_60;
  
  __s = fopen(FileName,"wb");
  switch(Vol->Type) {
  case int8:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar5 = Vol->Dims << 0x2b;
    lVar11 = lVar5 >> 0x2b;
    lVar3 = Vol->Dims << 0x16;
    lVar8 = (lVar3 >> 0x2b) * lVar11;
    lVar7 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar8;
    lVar8 = lVar8 * lVar9;
    local_60 = 0;
    if (lVar8 - lVar7 != 0) {
      lVar9 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar14 = (Vol->Buffer).Data;
      lVar10 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar12 = pbVar14 + lVar10 + lVar9 + lVar8;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar12,1,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar12 = pbVar12 + 1;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar12 = pbVar12 + (lVar11 - ((long)(uVar2 << 0x2b) >> 0x2b));
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar12 = pbVar12 + ((long)((int)(lVar3 >> 0x2b) * (int)(lVar5 >> 0x2b)) -
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar5 >> 0xb)) >> 0x20));
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar12 != pbVar14 + lVar7 + lVar9 + lVar10);
    }
    break;
  case uint8:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar5 = Vol->Dims << 0x2b;
    lVar11 = lVar5 >> 0x2b;
    lVar3 = Vol->Dims << 0x16;
    lVar8 = (lVar3 >> 0x2b) * lVar11;
    lVar7 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar8;
    lVar8 = lVar8 * lVar9;
    local_60 = 0;
    if (lVar8 - lVar7 != 0) {
      lVar9 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar14 = (Vol->Buffer).Data;
      lVar10 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar12 = pbVar14 + lVar10 + lVar9 + lVar8;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar12,1,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar12 = pbVar12 + 1;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar12 = pbVar12 + (lVar11 - ((long)(uVar2 << 0x2b) >> 0x2b));
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar12 = pbVar12 + ((long)((int)(lVar3 >> 0x2b) * (int)(lVar5 >> 0x2b)) -
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar5 >> 0xb)) >> 0x20));
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar12 != pbVar14 + lVar7 + lVar9 + lVar10);
    }
    break;
  case int16:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar7 = Vol->Dims << 0x2b;
    lVar11 = lVar7 >> 0x2b;
    lVar5 = Vol->Dims << 0x16;
    lVar3 = (lVar5 >> 0x2b) * lVar11;
    lVar8 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar3;
    lVar3 = lVar3 * lVar9 * 2;
    local_60 = 0;
    if (lVar3 != lVar8 * 2) {
      lVar10 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar12 = (Vol->Buffer).Data;
      lVar9 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar14 = pbVar12 + lVar10 * 2 + lVar9 * 2 + lVar3;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar14,2,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar14 = pbVar14 + 2;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar14 = pbVar14 + lVar11 * 2 + ((long)(uVar2 << 0x2b) >> 0x2b) * -2;
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar14 = pbVar14 + (long)((int)(lVar5 >> 0x2b) * (int)(lVar7 >> 0x2b)) * 2 +
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar7 >> 0xb)) >> 0x20) * -2;
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar14 != pbVar12 + lVar10 * 2 + lVar9 * 2 + lVar8 * 2);
    }
    break;
  case uint16:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar7 = Vol->Dims << 0x2b;
    lVar11 = lVar7 >> 0x2b;
    lVar5 = Vol->Dims << 0x16;
    lVar3 = (lVar5 >> 0x2b) * lVar11;
    lVar8 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar3;
    lVar3 = lVar3 * lVar9 * 2;
    local_60 = 0;
    if (lVar3 != lVar8 * 2) {
      lVar10 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar12 = (Vol->Buffer).Data;
      lVar9 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar14 = pbVar12 + lVar10 * 2 + lVar9 * 2 + lVar3;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar14,2,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar14 = pbVar14 + 2;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar14 = pbVar14 + lVar11 * 2 + ((long)(uVar2 << 0x2b) >> 0x2b) * -2;
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar14 = pbVar14 + (long)((int)(lVar5 >> 0x2b) * (int)(lVar7 >> 0x2b)) * 2 +
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar7 >> 0xb)) >> 0x20) * -2;
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar14 != pbVar12 + lVar10 * 2 + lVar9 * 2 + lVar8 * 2);
    }
    break;
  case int32:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar5 = Vol->Dims << 0x2b;
    lVar11 = lVar5 >> 0x2b;
    lVar3 = Vol->Dims << 0x16;
    lVar8 = (lVar3 >> 0x2b) * lVar11;
    lVar7 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar8;
    lVar8 = lVar8 * lVar9 * 4;
    local_60 = 0;
    if (lVar8 != lVar7 * 4) {
      lVar10 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar12 = (Vol->Buffer).Data;
      lVar9 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar14 = pbVar12 + lVar10 * 4 + lVar9 * 4 + lVar8;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar14,4,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar14 = pbVar14 + 4;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar14 = pbVar14 + lVar11 * 4 + ((long)(uVar2 << 0x2b) >> 0x2b) * -4;
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar14 = pbVar14 + (long)((int)(lVar3 >> 0x2b) * (int)(lVar5 >> 0x2b)) * 4 +
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar5 >> 0xb)) >> 0x20) * -4;
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar14 != pbVar12 + lVar10 * 4 + lVar9 * 4 + lVar7 * 4);
    }
    break;
  case uint32:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar5 = Vol->Dims << 0x2b;
    lVar11 = lVar5 >> 0x2b;
    lVar3 = Vol->Dims << 0x16;
    lVar8 = (lVar3 >> 0x2b) * lVar11;
    lVar7 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar8;
    lVar8 = lVar8 * lVar9 * 4;
    local_60 = 0;
    if (lVar8 != lVar7 * 4) {
      lVar10 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar12 = (Vol->Buffer).Data;
      lVar9 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar14 = pbVar12 + lVar10 * 4 + lVar9 * 4 + lVar8;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar14,4,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar14 = pbVar14 + 4;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar14 = pbVar14 + lVar11 * 4 + ((long)(uVar2 << 0x2b) >> 0x2b) * -4;
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar14 = pbVar14 + (long)((int)(lVar3 >> 0x2b) * (int)(lVar5 >> 0x2b)) * 4 +
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar5 >> 0xb)) >> 0x20) * -4;
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar14 != pbVar12 + lVar10 * 4 + lVar9 * 4 + lVar7 * 4);
    }
    break;
  case int64:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar5 = Vol->Dims << 0x2b;
    lVar11 = lVar5 >> 0x2b;
    lVar3 = Vol->Dims << 0x16;
    lVar8 = (lVar3 >> 0x2b) * lVar11;
    lVar7 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar8;
    lVar8 = lVar8 * lVar9 * 8;
    local_60 = 0;
    if (lVar8 != lVar7 * 8) {
      lVar10 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar12 = (Vol->Buffer).Data;
      lVar9 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar14 = pbVar12 + lVar10 * 8 + lVar9 * 8 + lVar8;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar14,8,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar14 = pbVar14 + 8;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar14 = pbVar14 + lVar11 * 8 + ((long)(uVar2 << 0x2b) >> 0x2b) * -8;
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar14 = pbVar14 + (long)((int)(lVar3 >> 0x2b) * (int)(lVar5 >> 0x2b)) * 8 +
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar5 >> 0xb)) >> 0x20) * -8;
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar14 != pbVar12 + lVar10 * 8 + lVar9 * 8 + lVar7 * 8);
    }
    break;
  case uint64:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar5 = Vol->Dims << 0x2b;
    lVar11 = lVar5 >> 0x2b;
    lVar3 = Vol->Dims << 0x16;
    lVar8 = (lVar3 >> 0x2b) * lVar11;
    lVar7 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar8;
    lVar8 = lVar8 * lVar9 * 8;
    local_60 = 0;
    if (lVar8 != lVar7 * 8) {
      lVar10 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar12 = (Vol->Buffer).Data;
      lVar9 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar14 = pbVar12 + lVar10 * 8 + lVar9 * 8 + lVar8;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar14,8,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar14 = pbVar14 + 8;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar14 = pbVar14 + lVar11 * 8 + ((long)(uVar2 << 0x2b) >> 0x2b) * -8;
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar14 = pbVar14 + (long)((int)(lVar3 >> 0x2b) * (int)(lVar5 >> 0x2b)) * 8 +
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar5 >> 0xb)) >> 0x20) * -8;
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar14 != pbVar12 + lVar10 * 8 + lVar9 * 8 + lVar7 * 8);
    }
    break;
  case float32:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar5 = Vol->Dims << 0x2b;
    lVar11 = lVar5 >> 0x2b;
    lVar3 = Vol->Dims << 0x16;
    lVar8 = (lVar3 >> 0x2b) * lVar11;
    lVar7 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar8;
    lVar8 = lVar8 * lVar9 * 4;
    local_60 = 0;
    if (lVar8 != lVar7 * 4) {
      lVar10 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar12 = (Vol->Buffer).Data;
      lVar9 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar14 = pbVar12 + lVar10 * 4 + lVar9 * 4 + lVar8;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar14,4,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar14 = pbVar14 + 4;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar14 = pbVar14 + lVar11 * 4 + ((long)(uVar2 << 0x2b) >> 0x2b) * -4;
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar14 = pbVar14 + (long)((int)(lVar3 >> 0x2b) * (int)(lVar5 >> 0x2b)) * 4 +
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar5 >> 0xb)) >> 0x20) * -4;
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar14 != pbVar12 + lVar10 * 4 + lVar9 * 4 + lVar7 * 4);
    }
    break;
  case float64:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar9 = (long)(uVar1 * 2) >> 0x2b;
    lVar5 = Vol->Dims << 0x2b;
    lVar11 = lVar5 >> 0x2b;
    lVar3 = Vol->Dims << 0x16;
    lVar8 = (lVar3 >> 0x2b) * lVar11;
    lVar7 = (((long)(uVar2 * 2) >> 0x2b) + lVar9) * lVar8;
    lVar8 = lVar8 * lVar9 * 8;
    local_60 = 0;
    if (lVar8 != lVar7 * 8) {
      lVar10 = (long)(uVar1 << 0x2b) >> 0x2b;
      pbVar12 = (Vol->Buffer).Data;
      lVar9 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar11;
      pbVar14 = pbVar12 + lVar10 * 8 + lVar9 * 8 + lVar8;
      iVar6 = 0;
      iVar13 = 0;
      do {
        sVar4 = fwrite(pbVar14,8,1,__s);
        if (sVar4 != 1) goto LAB_001897ba;
        iVar6 = iVar6 + 1;
        pbVar14 = pbVar14 + 8;
        if ((int)((long)(uVar2 << 0x2b) >> 0x2b) <= iVar6) {
          iVar13 = iVar13 + 1;
          pbVar14 = pbVar14 + lVar11 * 8 + ((long)(uVar2 << 0x2b) >> 0x2b) * -8;
          iVar6 = 0;
          if ((int)((long)(uVar2 << 0x16) >> 0x2b) <= iVar13) {
            pbVar14 = pbVar14 + (long)((int)(lVar3 >> 0x2b) * (int)(lVar5 >> 0x2b)) * 8 +
                                ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) *
                                       (lVar5 >> 0xb)) >> 0x20) * -8;
            iVar13 = 0;
            iVar6 = 0;
          }
        }
      } while (pbVar14 != pbVar12 + lVar10 * 8 + lVar9 * 8 + lVar7 * 8);
    }
    break;
  default:
    local_60 = 0;
  }
LAB_001897c4:
  *(char **)(*in_FS_OFFSET + -0x780) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x70;
  fclose(__s);
  eVar15.Code = (undefined4)local_60;
  eVar15.StackIdx = local_60._4_1_;
  eVar15.StrGened = (bool)local_60._5_1_;
  eVar15._14_2_ = local_60._6_2_;
  eVar15.Msg = "";
  return eVar15;
LAB_001897ba:
  local_60 = 0xc;
  goto LAB_001897c4;
}

Assistant:

error<>
WriteVolume(cstr FileName, const volume& Vol, const extent& Ext)
{
  FILE* Fp = fopen(FileName, "wb");
  idx2_CleanUp(fclose(Fp));
#define Body(type)                                                                                 \
  auto EndIt = End<type>(Ext, Vol);                                                                \
  for (auto It = Begin<type>(Ext, Vol); It != EndIt; ++It)                                         \
  {                                                                                                \
    if (fwrite(&(*It), sizeof(*It), 1, Fp) != 1)                                                   \
      return idx2_Error(err_code::FileWriteFailed);                                                \
  }
  idx2_DispatchOnType(Vol.Type) return idx2_Error(err_code::NoError);
#undef Body
}